

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

bool __thiscall DMenu::Responder(DMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  _func_int **pp_Var5;
  ulong uVar6;
  undefined8 uStack_20;
  
  if (ev->type != '\x04') {
    return false;
  }
  BVar1 = ev->subtype;
  if (BVar1 == '\x06') {
    BackbuttonTime = 0x8c;
    if (((this->super_DObject).field_0x24 == '\0') && (m_use_mouse.Value != 1)) {
      BackbuttonTime = 0x8c;
      return false;
    }
    bVar3 = MouseEventBack(this,1,(int)ev->data1,(int)ev->data2);
    if (bVar3) {
      ev->data2 = -1;
      uVar6 = 0xffffffffffffffff;
    }
    else {
      uVar6 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var5 = (this->super_DObject)._vptr_DObject;
    uStack_20 = 1;
  }
  else {
    if (BVar1 != '\b') {
      if (BVar1 != '\a') {
        return false;
      }
      bVar3 = MouseEventBack(this,0,(int)ev->data1,(int)ev->data2);
      if (bVar3) {
        ev->data2 = -1;
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = (ulong)(uint)(int)ev->data2;
      }
      iVar4 = (*(this->super_DObject)._vptr_DObject[0xe])(this,0,(ulong)(uint)(int)ev->data1,uVar6);
      if ((byte)(bVar3 | (byte)iVar4) != 1) {
        return false;
      }
      SetCapture(this);
      return false;
    }
    if ((this->super_DObject).field_0x24 != '\x01') {
      return false;
    }
    ReleaseCapture(this);
    bVar3 = MouseEventBack(this,2,(int)ev->data1,(int)ev->data2);
    if (bVar3) {
      ev->data2 = -1;
      uVar6 = 0xffffffffffffffff;
    }
    else {
      uVar6 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var5 = (this->super_DObject)._vptr_DObject;
    uStack_20 = 2;
  }
  (*pp_Var5[0xe])(this,uStack_20,(ulong)(uint)(int)sVar2,uVar6);
  return false;
}

Assistant:

bool DMenu::Responder (event_t *ev) 
{ 
	bool res = false;
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_LButtonDown)
		{
			res = MouseEventBack(MOUSE_Click, ev->data1, ev->data2);
			// make the menu's mouse handler believe that the current coordinate is outside the valid range
			if (res) ev->data2 = -1;	
			res |= MouseEvent(MOUSE_Click, ev->data1, ev->data2);
			if (res)
			{
				SetCapture();
			}
			
		}
		else if (ev->subtype == EV_GUI_MouseMove)
		{
			BackbuttonTime = BACKBUTTON_TIME;
			if (mMouseCapture || m_use_mouse == 1)
			{
				res = MouseEventBack(MOUSE_Move, ev->data1, ev->data2);
				if (res) ev->data2 = -1;	
				res |= MouseEvent(MOUSE_Move, ev->data1, ev->data2);
			}
		}
		else if (ev->subtype == EV_GUI_LButtonUp)
		{
			if (mMouseCapture)
			{
				ReleaseCapture();
				res = MouseEventBack(MOUSE_Release, ev->data1, ev->data2);
				if (res) ev->data2 = -1;	
				res |= MouseEvent(MOUSE_Release, ev->data1, ev->data2);
			}
		}
	}
	return false; 
}